

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Geometry.h
# Opt level: O1

Vec3f TRM::barycentric<3ul>
                (vec<3,_float,_(glm::qualifier)0> A,vec<3,_float,_(glm::qualifier)0> B,
                vec<3,_float,_(glm::qualifier)0> C,vec<3,_float,_(glm::qualifier)0> P)

{
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 *paVar1;
  int iVar2;
  long lVar3;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 aVar4;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 aVar5;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 aVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 aVar10;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 aVar11;
  Vec3f VVar12;
  Vec3f VVar13;
  Vec3f s [2];
  
  aVar6 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)A.field_2;
  aVar4 = A.field_0;
  aVar5 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)A.field_1;
  paVar1 = &s[0].field_2;
  lVar3 = 0;
  do {
    iVar2 = (int)lVar3;
    aVar10.x = C.field_2;
    if ((iVar2 != 2) && (aVar10 = C.field_0, iVar2 == 1)) {
      aVar10.x = C.field_1;
    }
    aVar11 = aVar6;
    if ((iVar2 != 2) && (aVar11 = aVar4, iVar2 == 1)) {
      aVar11 = aVar5;
    }
    (((Vec3f *)(paVar1 + -2))->field_0).x = aVar10.x - aVar11.x;
    aVar10.x = B.field_2;
    if ((iVar2 != 2) && (aVar10 = B.field_0, iVar2 == 1)) {
      aVar10.x = B.field_1;
    }
    aVar11 = aVar6;
    if ((iVar2 != 2) && (aVar11 = aVar4, iVar2 == 1)) {
      aVar11 = aVar5;
    }
    ((anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5 *)(paVar1 + -1))->y =
         aVar10.x - aVar11.x;
    aVar10 = aVar6;
    if ((iVar2 != 2) && (aVar10 = aVar4, iVar2 == 1)) {
      aVar10 = aVar5;
    }
    aVar11.x = P.field_2;
    if ((iVar2 != 2) && (aVar11 = P.field_0, iVar2 == 1)) {
      aVar11.x = P.field_1;
    }
    paVar1->z = aVar10.x - aVar11.x;
    lVar3 = lVar3 + 1;
    paVar1 = paVar1 + 3;
  } while (lVar3 == 1);
  fVar9 = s[0].field_0.x * s[1].field_1.y - s[0].field_1.y * s[1].field_0.x;
  if (ABS(fVar9) <= 0.01) {
    VVar13.field_2.z = 1.0;
    VVar13.field_0 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)0xbf800000;
    VVar13.field_1 = (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)0x3f800000;
    return VVar13;
  }
  fVar8 = s[1].field_0.x * s[0].field_2.z - s[0].field_0.x * s[1].field_2.z;
  fVar7 = s[0].field_1.y * s[1].field_2.z - s[1].field_1.y * s[0].field_2.z;
  VVar12.field_0 = 1.0 - (fVar7 + fVar8) / fVar9;
  VVar12.field_1.y = fVar8 / fVar9;
  VVar12.field_2.z = fVar7 / fVar9;
  return VVar12;
}

Assistant:

Vec3f barycentric(glm::vec<DimRows, float, glm::defaultp> A,
                  glm::vec<DimRows, float, glm::defaultp> B,
                  glm::vec<DimRows, float, glm::defaultp> C,
                  glm::vec<DimRows, float, glm::defaultp> P) {
  if (DimRows < 2) {
    return Vec3f(1., 1., 1.);
  } else {
    Vec3f s[2];
    for (int i = 0; i < 2; i++) {
      s[i][0] = C[i] - A[i];
      s[i][1] = B[i] - A[i];
      s[i][2] = A[i] - P[i];
    }
    Vec3f u = cross(s[0], s[1]);
    if (std::abs(u[2]) > 1e-2)  // dont forget that u[2] is integer. If it is
                                // zero then triangle ABC is degenerate
      return Vec3f(1.f - (u.x + u.y) / u.z, u.y / u.z, u.x / u.z);
    return Vec3f(-1, 1, 1);  // in this case generate negative coordinates, it
                             // will be thrown away by the rasterizator
  }
}